

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O2

void __thiscall
transwarp::detail::task_impl_base<$1a67ba37$>::remove_listener_all
          (task_impl_base<_1a67ba37_> *this,shared_ptr<transwarp::listener> *listener)

{
  __shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2> local_38;
  remove_listener_visitor local_28;
  
  ensure_task_not_running(this);
  std::__shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             &listener->super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>);
  local_28.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38._M_ptr;
  local_28.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = local_38._M_refcount._M_pi;
  local_38._M_ptr = (element_type *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  visit_depth_all<transwarp::detail::remove_listener_visitor>(this,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void remove_listener_all(const std::shared_ptr<transwarp::listener>& listener) override {
        ensure_task_not_running();
        transwarp::detail::remove_listener_visitor visitor(std::move(listener));
        visit_depth_all(visitor);
    }